

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# envyas.c
# Opt level: O1

int resolve(asctx *ctx,ull *val,match m,ull pos)

{
  byte bVar1;
  int iVar2;
  rbitfield *bf;
  ull uVar3;
  ull uVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  easm_expr **ppeVar8;
  
  if (0 < m.nrelocs) {
    ppeVar8 = &m.relocs[0].expr;
    lVar6 = 0;
    do {
      uVar3 = calc(*ppeVar8,ctx);
      bf = ((reloc *)(ppeVar8 + -1))->bf;
      uVar7 = uVar3 - bf->addend;
      if (bf->pcrel != 0) {
        bVar1 = (byte)bf->shr;
        uVar7 = uVar7 - ((bf->pospreadd + pos >> (bVar1 & 0x3f)) << (bVar1 & 0x3f));
      }
      uVar7 = uVar7 >> ((byte)bf->shr & 0x3f);
      setsbf(&m,bf->sbf[0].pos,bf->sbf[0].len,uVar7);
      setsbf(&m,bf->sbf[1].pos,bf->sbf[1].len,uVar7 >> ((byte)bf->sbf[0].len & 0x3f));
      ctx->pos = (uint32_t)pos;
      uVar5 = bf->sbf[0].len + bf->shr + bf->sbf[1].len;
      uVar7 = ~(-1L << ((byte)uVar5 & 0x3f));
      if (0x3f < uVar5) {
        uVar7 = 0xffffffffffffffff;
      }
      iVar2 = bf->wrapok;
      uVar4 = getrbf_as(bf,m.a,m.m,pos & 0xffffffff);
      if (((-(ulong)(iVar2 == 0) | uVar7) & (uVar4 ^ uVar3)) != 0) {
        return 0;
      }
      lVar6 = lVar6 + 1;
      ppeVar8 = ppeVar8 + 2;
    } while (lVar6 < m.nrelocs);
  }
  *val = m.a[0];
  val[1] = m.a[1];
  return 1;
}

Assistant:

int resolve (struct asctx *ctx, ull *val, struct match m, ull pos) {
	int i;
	for (i = 0; i < m.nrelocs; i++) {
		ull val = calc(m.relocs[i].expr, ctx);
		const struct rbitfield *bf = m.relocs[i].bf;
		ull num = val - bf->addend;
		if (bf->pcrel)
			num -= (pos + bf->pospreadd) & -(1ull << bf->shr);
		num >>= bf->shr;
		setsbf(&m, bf->sbf[0].pos, bf->sbf[0].len, num);
		num >>= bf->sbf[0].len;
		setsbf(&m, bf->sbf[1].pos, bf->sbf[1].len, num);
		ctx->pos = pos;
		ull mask = ~0ull;
		ull totalsz = bf->shr + bf->sbf[0].len + bf->sbf[1].len;
		if (bf->wrapok && totalsz < 64)
			mask = (1ull << totalsz) - 1;
		if ((getrbf_as(bf, m.a, m.m, ctx->pos) & mask) != (val & mask))
			return 0;
	}
	for (i = 0; i < MAXOPLEN; i++)
		val[i] = m.a[i];
	return 1;
}